

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker.cpp
# Opt level: O0

string * __thiscall Tracker::logSamples_abi_cxx11_(string *__return_storage_ptr__,Tracker *this)

{
  ulong uVar1;
  size_type sVar2;
  reference _track;
  string local_58;
  ulong local_38;
  size_t t;
  allocator local_1a;
  undefined1 local_19;
  Tracker *local_18;
  Tracker *this_local;
  string *log;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Tracker *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  for (local_38 = 0; uVar1 = local_38,
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->m_tracks), uVar1 < sVar2; local_38 = local_38 + 1) {
    _track = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->m_tracks,local_38);
    logSamples(&local_58,this,_track);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Tracker::logSamples() {
    std::string log = "";

    for (size_t t = 0; t < m_tracks.size(); t++)
        log += logSamples(m_tracks[t]);

    return log;
}